

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readVVVV(InternalInstruction *insn)

{
  byte bVar1;
  int vvvv;
  InternalInstruction *insn_local;
  
  if (insn->vectorExtensionType == TYPE_EVEX) {
    vvvv = ((int)((insn->vectorExtensionPrefix[3] ^ 0xffffffff) & 8) >> 3) << 4 |
           (int)((insn->vectorExtensionPrefix[2] ^ 0xffffffff) & 0x78) >> 3;
  }
  else {
    if (insn->vectorExtensionType == TYPE_VEX_3B) {
      bVar1 = insn->vectorExtensionPrefix[2];
    }
    else if (insn->vectorExtensionType == TYPE_VEX_2B) {
      bVar1 = insn->vectorExtensionPrefix[1];
    }
    else {
      if (insn->vectorExtensionType != TYPE_XOP) {
        return -1;
      }
      bVar1 = insn->vectorExtensionPrefix[2];
    }
    vvvv = (int)((bVar1 ^ 0xffffffff) & 0x78) >> 3;
  }
  if (insn->mode != MODE_64BIT) {
    vvvv = vvvv & 7;
  }
  insn->vvvv = vvvv;
  return 0;
}

Assistant:

static int readVVVV(struct InternalInstruction *insn)
{
	int vvvv;
	// dbgprintf(insn, "readVVVV()");

	if (insn->vectorExtensionType == TYPE_EVEX)
		vvvv = (v2FromEVEX4of4(insn->vectorExtensionPrefix[3]) << 4 |
				vvvvFromEVEX3of4(insn->vectorExtensionPrefix[2]));
	else if (insn->vectorExtensionType == TYPE_VEX_3B)
		vvvv = vvvvFromVEX3of3(insn->vectorExtensionPrefix[2]);
	else if (insn->vectorExtensionType == TYPE_VEX_2B)
		vvvv = vvvvFromVEX2of2(insn->vectorExtensionPrefix[1]);
	else if (insn->vectorExtensionType == TYPE_XOP)
		vvvv = vvvvFromXOP3of3(insn->vectorExtensionPrefix[2]);
	else
		return -1;

	if (insn->mode != MODE_64BIT)
		vvvv &= 0x7;

	insn->vvvv = vvvv;

	return 0;
}